

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScalePlaneVertical(int src_height,int dst_width,int dst_height,int src_stride,int dst_stride,
                       uint8_t *src_argb,uint8_t *dst_argb,int x,int y,int dy,int bpp,
                       FilterMode filtering)

{
  uint uVar1;
  code *pcVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = dst_width * bpp;
  uVar4 = 0;
  if (1 < src_height) {
    uVar4 = src_height * 0x10000 - 0x10001;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar5 & 0xf) == 0) {
    pcVar3 = InterpolateRow_SSSE3;
  }
  else {
    pcVar3 = InterpolateRow_Any_SSSE3;
  }
  if ((uVar1 & 0x40) == 0) {
    pcVar3 = InterpolateRow_C;
  }
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  if ((uVar5 & 0x1f) == 0) {
    pcVar2 = InterpolateRow_AVX2;
  }
  else {
    pcVar2 = InterpolateRow_Any_AVX2;
  }
  if ((uVar1 >> 10 & 1) == 0) {
    pcVar2 = pcVar3;
  }
  if (0 < dst_height) {
    do {
      if ((int)uVar4 <= y) {
        y = uVar4;
      }
      uVar1 = (uint)y >> 8 & 0xff;
      if (filtering == kFilterNone) {
        uVar1 = 0;
      }
      (*pcVar2)(dst_argb,src_argb + (long)(src_stride * (y >> 0x10)) + (long)(x._2_2_ * bpp),
                (long)src_stride,uVar5,uVar1);
      dst_argb = dst_argb + dst_stride;
      y = y + dy;
      dst_height = dst_height + -1;
    } while (dst_height != 0);
  }
  return;
}

Assistant:

void ScalePlaneVertical(int src_height,
                        int dst_width,
                        int dst_height,
                        int src_stride,
                        int dst_stride,
                        const uint8_t* src_argb,
                        uint8_t* dst_argb,
                        int x,
                        int y,
                        int dy,
                        int bpp,
                        enum FilterMode filtering) {
  // TODO(fbarchard): Allow higher bpp.
  int dst_width_bytes = dst_width * bpp;
  void (*InterpolateRow)(uint8_t * dst_argb, const uint8_t* src_argb,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  const int max_y = (src_height > 1) ? ((src_height - 1) << 16) - 1 : 0;
  int j;
  assert(bpp >= 1 && bpp <= 4);
  assert(src_height != 0);
  assert(dst_width > 0);
  assert(dst_height > 0);
  src_argb += (x >> 16) * bpp;
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width_bytes, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(dst_width_bytes, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(dst_width_bytes, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif
  for (j = 0; j < dst_height; ++j) {
    int yi;
    int yf;
    if (y > max_y) {
      y = max_y;
    }
    yi = y >> 16;
    yf = filtering ? ((y >> 8) & 255) : 0;
    InterpolateRow(dst_argb, src_argb + yi * src_stride, src_stride,
                   dst_width_bytes, yf);
    dst_argb += dst_stride;
    y += dy;
  }
}